

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.h
# Opt level: O0

pointer_type
cppcms::impl::
mfunc_to_event_handler<cppcms::impl::cgi::fastcgi,std::shared_ptr<cppcms::impl::cgi::fastcgi>,booster::callback<void(std::error_code_const&)>const&,booster::callback<void(std::error_code_const&)>>
          (offset_in_fastcgi_to_subr f,shared_ptr<cppcms::impl::cgi::fastcgi> *s,
          callback<void_(const_std::error_code_&)> *p1)

{
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *this;
  event_handler_binder_p1<void_(cppcms::impl::cgi::fastcgi::*)(const_std::error_code_&,_const_booster::callback<void_(const_std::error_code_&)>_&),_std::shared_ptr<cppcms::impl::cgi::fastcgi>,_booster::callback<void_(const_std::error_code_&)>_>
  *in_RCX;
  callable<void_(const_std::error_code_&)> *in_RDI;
  offset_in_fastcgi_to_subr *in_R8;
  callback<void_(const_std::error_code_&)> *in_stack_ffffffffffffffb8;
  shared_ptr<cppcms::impl::cgi::fastcgi> *in_stack_ffffffffffffffc0;
  event_handler_binder_p1<void_(cppcms::impl::cgi::fastcgi::*)(const_std::error_code_&,_const_booster::callback<void_(const_std::error_code_&)>_&),_std::shared_ptr<cppcms::impl::cgi::fastcgi>,_booster::callback<void_(const_std::error_code_&)>_>
  *this_00;
  
  this_00 = in_RCX;
  this = (intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)operator_new(0x38);
  event_handler_binder_p1<void_(cppcms::impl::cgi::fastcgi::*)(const_std::error_code_&,_const_booster::callback<void_(const_std::error_code_&)>_&),_std::shared_ptr<cppcms::impl::cgi::fastcgi>,_booster::callback<void_(const_std::error_code_&)>_>
  ::event_handler_binder_p1(this_00,in_R8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::intrusive_ptr
            (this,&in_RCX->super_callable_type,SUB81((ulong)in_RDI >> 0x38,0));
  return (pointer_type)in_RDI;
}

Assistant:

booster::aio::event_handler::pointer_type mfunc_to_event_handler(void (C::*f)(booster::system::error_code const &,P1),S s,P1in const &p1)
{
	return new event_handler_binder_p1<void (C::*)(booster::system::error_code const &,P1),S,P1in>(f,s,p1);
}